

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::compiler::CodeGenerator::BuildFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          CodeGenerator *this)

{
  Descriptor *this_00;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Edition in_stack_ffffffffffffffc8;
  undefined4 uStack_34;
  pointer local_30;
  
  this_00 = FeatureSet::GetDescriptor();
  (*this->_vptr_CodeGenerator[6])(&stack0xffffffffffffffc8,this);
  extensions.ptr_ =
       (pointer)((long)local_30 - (long)CONCAT44(uStack_34,in_stack_ffffffffffffffc8) >> 3);
  extensions.len_ = 0x3e6;
  FeatureResolver::CompileDefaults
            (__return_storage_ptr__,(FeatureResolver *)this_00,
             (Descriptor *)CONCAT44(uStack_34,in_stack_ffffffffffffffc8),extensions,EDITION_2024,
             in_stack_ffffffffffffffc8);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> CodeGenerator::BuildFeatureSetDefaults()
    const {
  // For generators that don't fully support editions yet, provide an
  // optimistic set of defaults.  Protoc will check this condition later
  // anyway.
  return FeatureResolver::CompileDefaults(
      FeatureSet::descriptor(), GetFeatureExtensions(), ProtocMinimumEdition(),
      MaximumKnownEdition());
}